

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

int __thiscall Poller::Init(Poller *this,int size,int timeout)

{
  int iVar1;
  EventContext *pEVar2;
  epoll_event *peVar3;
  int timeout_local;
  int size_local;
  Poller *this_local;
  
  pEVar2 = (EventContext *)malloc(0x28);
  this->context = pEVar2;
  if (this->context == (EventContext *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    iVar1 = epoll_create(32000);
    this->context->epollfd = iVar1;
    if (this->context->epollfd < 0) {
      free(this->context);
      this_local._4_4_ = -1;
    }
    else {
      this->context->timeout = timeout;
      this->context->nevents = size;
      peVar3 = (epoll_event *)malloc((long)size * 0xc);
      this->context->events = peVar3;
      if (this->context->events == (epoll_event *)0x0) {
        close(this->context->epollfd);
        free(this->context);
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Poller::Init(int size, int timeout) {
    context = (struct EventContext*)malloc(sizeof(struct EventContext));
    if (context == nullptr) {
        return -1;
    }
    context->epollfd = epoll_create(32000);
    if (context->epollfd < 0) {
        free(context);
        return -1;
    }
    context->timeout = timeout;
    context->nevents = size;
    context->events = (struct epoll_event*)malloc(sizeof(struct epoll_event) * size);
    if (context->events == nullptr) {
        close(context->epollfd);
        free(context);
        return -1;
    }
    
    return 0;
}